

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O2

Endpoint * __thiscall prometheus::Exposer::GetEndpointForUri(Exposer *this,string *uri)

{
  unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
  *puVar1;
  Endpoint *pEVar2;
  bool bVar3;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  __it;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  _Var4;
  long lVar5;
  long lVar6;
  anon_class_32_1_ba1d80cc_for__M_pred sameUri;
  unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
  local_e0 [4];
  vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
  *local_c0;
  string *local_b8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_b8 = uri;
  std::__cxx11::string::string(local_50,(string *)uri);
  __it._M_current =
       (this->endpoints_).
       super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->endpoints_).
           super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_b0,local_50);
  std::__cxx11::string::string(local_90,local_b0);
  std::__cxx11::string::string((string *)local_e0,local_90);
  std::__cxx11::string::string(local_70,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::string((string *)local_e0,local_70);
  local_c0 = (vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
              *)&this->endpoints_;
  lVar6 = (long)puVar1 - (long)__it._M_current;
  for (lVar5 = lVar6 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                        *)local_e0,__it);
    _Var4._M_current = __it._M_current;
    if (bVar3) goto LAB_00108c1b;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                        *)local_e0,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_00108c1b;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                        *)local_e0,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_00108c1b;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                        *)local_e0,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_00108c1b;
    __it._M_current = __it._M_current + 4;
    lVar6 = lVar6 + -0x20;
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      _Var4._M_current = puVar1;
      if ((lVar6 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                                *)local_e0,__it), _Var4._M_current = __it._M_current, bVar3))
      goto LAB_00108c1b;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                        *)local_e0,__it);
    _Var4._M_current = __it._M_current;
    if (bVar3) goto LAB_00108c1b;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                      *)local_e0,__it);
  _Var4._M_current = puVar1;
  if (bVar3) {
    _Var4._M_current = __it._M_current;
  }
LAB_00108c1b:
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  if (_Var4._M_current ==
      (this->endpoints_).
      super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    detail::make_unique<prometheus::detail::Endpoint,CivetServer&,std::__cxx11::string_const&>
              ((detail *)local_e0,
               (this->server_)._M_t.
               super___uniq_ptr_impl<CivetServer,_std::default_delete<CivetServer>_>._M_t.
               super__Tuple_impl<0UL,_CivetServer_*,_std::default_delete<CivetServer>_>.
               super__Head_base<0UL,_CivetServer_*,_false>._M_head_impl,local_b8);
    std::
    vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
    ::
    emplace_back<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>
              (local_c0,local_e0);
    std::
    unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>::
    ~unique_ptr(local_e0);
    _Var4._M_current =
         (this->endpoints_).
         super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  pEVar2 = ((_Var4._M_current)->_M_t).
           super___uniq_ptr_impl<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
           ._M_t.
           super__Tuple_impl<0UL,_prometheus::detail::Endpoint_*,_std::default_delete<prometheus::detail::Endpoint>_>
           .super__Head_base<0UL,_prometheus::detail::Endpoint_*,_false>._M_head_impl;
  std::__cxx11::string::~string(local_50);
  return pEVar2;
}

Assistant:

detail::Endpoint& Exposer::GetEndpointForUri(const std::string& uri) {
  auto sameUri = [uri](const std::unique_ptr<detail::Endpoint>& endpoint) {
    return endpoint->GetURI() == uri;
  };
  auto it = std::find_if(std::begin(endpoints_), std::end(endpoints_), sameUri);
  if (it != std::end(endpoints_)) {
    return *it->get();
  }

  endpoints_.emplace_back(detail::make_unique<detail::Endpoint>(*server_, uri));
  return *endpoints_.back().get();
}